

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

float * stbi__hdr_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  stbi_uc sVar1;
  stbi_uc sVar2;
  stbi_uc sVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  float *output;
  void *__ptr;
  long lVar11;
  int *piVar12;
  ulong uVar13;
  ulong uVar14;
  char *pcVar15;
  int add;
  uint uVar16;
  long lVar17;
  uint a;
  void *pvVar18;
  float *output_00;
  int c;
  bool bVar19;
  float *local_490;
  char *local_448;
  stbi_uc rgbe [4];
  stbi_uc rgbe_1 [4];
  char buffer [1024];
  
  uVar9 = (ulong)(uint)req_comp;
  piVar12 = comp;
  stbi__hdr_gettoken(s,buffer);
  iVar5 = bcmp(buffer,"#?RADIANCE",0xb);
  if ((iVar5 == 0) || (iVar5 = bcmp(buffer,"#?RGBE",7), iVar5 == 0)) {
    bVar19 = false;
    iVar5 = 1;
    while( true ) {
      stbi__hdr_gettoken(s,buffer);
      iVar6 = (int)piVar12;
      add = (int)uVar9;
      if (buffer[0] == '\0') break;
      iVar6 = bcmp(buffer,"FORMAT=32-bit_rle_rgbe",0x17);
      if (iVar6 == 0) {
        bVar19 = true;
      }
    }
    if (bVar19) {
      stbi__hdr_gettoken(s,buffer);
      iVar7 = bcmp(buffer,"-Y ",3);
      if (iVar7 == 0) {
        local_448 = buffer + 3;
        uVar9 = strtol(local_448,&local_448,10);
        local_448 = local_448 + 2;
        do {
          pcVar15 = local_448;
          local_448 = pcVar15 + 1;
        } while (pcVar15[-2] == ' ');
        if (((pcVar15[-2] == '+') && (pcVar15[-1] == 'X')) && (*pcVar15 == ' ')) {
          uVar10 = strtol(local_448,(char **)0x0,10);
          a = (uint)uVar10;
          *x = a;
          iVar7 = (int)uVar9;
          *y = iVar7;
          if (comp != (int *)0x0) {
            *comp = 3;
          }
          c = 3;
          if (req_comp != 0) {
            c = req_comp;
          }
          iVar8 = stbi__mad4sizes_valid(a,iVar7,c,iVar6,add);
          if (iVar8 == 0) {
            stbi__g_failure_reason = "too large";
            return (float *)0x0;
          }
          output = (float *)stbi__malloc_mad4(a,iVar7,c,iVar6,add);
          if (output != (float *)0x0) {
            iVar6 = 0;
            if (a - 0x8000 < 0xffff8008) goto LAB_0015f058;
            uVar13 = 0;
            uVar14 = 0;
            if (0 < iVar7) {
              uVar14 = uVar9 & 0xffffffff;
            }
            __ptr = (void *)0x0;
            local_490 = output;
            while( true ) {
              if (uVar13 == uVar14) {
                free(__ptr);
                return output;
              }
              sVar1 = stbi__get8(s);
              sVar2 = stbi__get8(s);
              sVar3 = stbi__get8(s);
              if (((sVar1 != '\x02') || (sVar2 != '\x02')) || ((char)sVar3 < '\0')) {
                rgbe[0] = sVar1;
                rgbe[1] = sVar2;
                rgbe[2] = sVar3;
                rgbe[3] = stbi__get8(s);
                stbi__hdr_convert(output,rgbe,c);
                free(__ptr);
                iVar6 = 0;
                do {
                  stbi__getn(s,rgbe_1,4);
                  stbi__hdr_convert(output + (long)(int)(c * a * iVar6) + (long)(iVar5 * c),rgbe_1,c
                                   );
                  iVar5 = iVar5 + 1;
                  while ((int)a <= iVar5) {
                    iVar6 = iVar6 + 1;
LAB_0015f058:
                    iVar5 = 0;
                    if (iVar7 <= iVar6) {
                      return output;
                    }
                  }
                } while( true );
              }
              sVar1 = stbi__get8(s);
              if (CONCAT11(sVar3,sVar1) != a) {
                free(output);
                free(__ptr);
                stbi__g_failure_reason = "invalid decoded scanline length";
                return (float *)0x0;
              }
              if ((__ptr == (void *)0x0) && (__ptr = stbi__malloc_mad2(a,4,0), __ptr == (void *)0x0)
                 ) break;
              pvVar18 = __ptr;
              for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
                lVar17 = 0;
                while( true ) {
                  iVar6 = (int)lVar17;
                  if ((int)a <= iVar6) break;
                  bVar4 = stbi__get8(s);
                  uVar16 = (uint)bVar4;
                  if (bVar4 < 0x81) {
                    if (a - iVar6 < (uint)bVar4) goto LAB_0015efc6;
                    lVar17 = (long)iVar6;
                    while (bVar19 = uVar16 != 0, uVar16 = uVar16 - 1, bVar19) {
                      sVar1 = stbi__get8(s);
                      *(stbi_uc *)((long)pvVar18 + lVar17 * 4) = sVar1;
                      lVar17 = lVar17 + 1;
                    }
                  }
                  else {
                    sVar1 = stbi__get8(s);
                    uVar16 = bVar4 & 0x7f;
                    if (a - iVar6 < uVar16) {
LAB_0015efc6:
                      free(output);
                      free(__ptr);
                      stbi__g_failure_reason = "corrupt";
                      return (float *)0x0;
                    }
                    lVar17 = (long)iVar6;
                    while (bVar19 = uVar16 != 0, uVar16 = uVar16 - 1, bVar19) {
                      *(stbi_uc *)((long)pvVar18 + lVar17 * 4) = sVar1;
                      lVar17 = lVar17 + 1;
                    }
                  }
                }
                pvVar18 = (void *)((long)pvVar18 + 1);
              }
              output_00 = local_490;
              for (lVar11 = 0; (uVar10 & 0xffffffff) << 2 != lVar11; lVar11 = lVar11 + 4) {
                stbi__hdr_convert(output_00,(stbi_uc *)((long)__ptr + lVar11),c);
                output_00 = output_00 + c;
              }
              uVar13 = uVar13 + 1;
              local_490 = local_490 + (long)c * (uVar10 & 0xffffffff);
            }
            free(output);
          }
          stbi__g_failure_reason = "outofmem";
          return (float *)0x0;
        }
      }
      stbi__g_failure_reason = "unsupported data layout";
    }
    else {
      stbi__g_failure_reason = "unsupported format";
    }
  }
  else {
    stbi__g_failure_reason = "not HDR";
  }
  return (float *)0x0;
}

Assistant:

static float *stbi__hdr_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   char buffer[STBI__HDR_BUFLEN];
   char *token;
   int valid = 0;
   int width, height;
   stbi_uc *scanline;
   float *hdr_data;
   int len;
   unsigned char count, value;
   int i, j, k, c1,c2, z;
   const char *headerToken;
   STBI_NOTUSED(ri);

   // Check identifier
   headerToken = stbi__hdr_gettoken(s,buffer);
   if (strcmp(headerToken, "#?RADIANCE") != 0 && strcmp(headerToken, "#?RGBE") != 0)
      return stbi__errpf("not HDR", "Corrupt HDR image");

   // Parse header
   for(;;) {
      token = stbi__hdr_gettoken(s,buffer);
      if (token[0] == 0) break;
      if (strcmp(token, "FORMAT=32-bit_rle_rgbe") == 0) valid = 1;
   }

   if (!valid)    return stbi__errpf("unsupported format", "Unsupported HDR format");

   // Parse width and height
   // can't use sscanf() if we're not using stdio!
   token = stbi__hdr_gettoken(s,buffer);
   if (strncmp(token, "-Y ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   height = (int) strtol(token, &token, 10);
   while (*token == ' ') ++token;
   if (strncmp(token, "+X ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   width = (int) strtol(token, NULL, 10);

   *x = width;
   *y = height;

   if (comp) *comp = 3;
   if (req_comp == 0) req_comp = 3;

   if (!stbi__mad4sizes_valid(width, height, req_comp, sizeof(float), 0))
      return stbi__errpf("too large", "HDR image is too large");

   // Read data
   hdr_data = (float *) stbi__malloc_mad4(width, height, req_comp, sizeof(float), 0);
   if (!hdr_data)
      return stbi__errpf("outofmem", "Out of memory");

   // Load image data
   // image data is stored as some number of sca
   if ( width < 8 || width >= 32768) {
      // Read flat data
      for (j=0; j < height; ++j) {
         for (i=0; i < width; ++i) {
            stbi_uc rgbe[4];
           main_decode_loop:
            stbi__getn(s, rgbe, 4);
            stbi__hdr_convert(hdr_data + j * width * req_comp + i * req_comp, rgbe, req_comp);
         }
      }
   } else {
      // Read RLE-encoded data
      scanline = NULL;

      for (j = 0; j < height; ++j) {
         c1 = stbi__get8(s);
         c2 = stbi__get8(s);
         len = stbi__get8(s);
         if (c1 != 2 || c2 != 2 || (len & 0x80)) {
            // not run-length encoded, so we have to actually use THIS data as a decoded
            // pixel (note this can't be a valid pixel--one of RGB must be >= 128)
            stbi_uc rgbe[4];
            rgbe[0] = (stbi_uc) c1;
            rgbe[1] = (stbi_uc) c2;
            rgbe[2] = (stbi_uc) len;
            rgbe[3] = (stbi_uc) stbi__get8(s);
            stbi__hdr_convert(hdr_data, rgbe, req_comp);
            i = 1;
            j = 0;
            STBI_FREE(scanline);
            goto main_decode_loop; // yes, this makes no sense
         }
         len <<= 8;
         len |= stbi__get8(s);
         if (len != width) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("invalid decoded scanline length", "corrupt HDR"); }
         if (scanline == NULL) {
            scanline = (stbi_uc *) stbi__malloc_mad2(width, 4, 0);
            if (!scanline) {
               STBI_FREE(hdr_data);
               return stbi__errpf("outofmem", "Out of memory");
            }
         }

         for (k = 0; k < 4; ++k) {
            int nleft;
            i = 0;
            while ((nleft = width - i) > 0) {
               count = stbi__get8(s);
               if (count > 128) {
                  // Run
                  value = stbi__get8(s);
                  count -= 128;
                  if (count > nleft) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("corrupt", "bad RLE data in HDR"); }
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = value;
               } else {
                  // Dump
                  if (count > nleft) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("corrupt", "bad RLE data in HDR"); }
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = stbi__get8(s);
               }
            }
         }
         for (i=0; i < width; ++i)
            stbi__hdr_convert(hdr_data+(j*width + i)*req_comp, scanline + i*4, req_comp);
      }
      if (scanline)
         STBI_FREE(scanline);
   }

   return hdr_data;
}